

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::Mixin::_InternalSerialize(Mixin *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Mixin *pMVar1;
  bool bVar2;
  uint uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  WireFormatLite *pWVar6;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view sVar7;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  Mixin *pMStack_28;
  uint32_t cached_has_bits;
  Mixin *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Mixin *this_local;
  
  _s._4_4_ = 0;
  pMStack_28 = this;
  this_ = (Mixin *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar4 & 1) != 0) {
    _internal_name_abi_cxx11_(pMStack_28);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_38 = _internal_name_abi_cxx11_(pMStack_28);
      pWVar6 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"google.protobuf.Mixin.name");
      sVar7._M_str = in_R9;
      sVar7._M_len = (size_t)local_48._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar6,(char *)(ulong)uVar3,1,(Operation)local_48._M_len,sVar7);
      pMVar1 = this_;
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = sVar7._M_str;
      _s_1 = (string *)sVar7._M_len;
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pMVar1,1,sVar7,(uint8_t *)stream_local);
    }
  }
  puVar4 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if ((*puVar4 & 2) != 0) {
    _internal_root_abi_cxx11_(pMStack_28);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_60 = _internal_root_abi_cxx11_(pMStack_28);
      pWVar6 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"google.protobuf.Mixin.root");
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)local_70._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar6,(char *)(ulong)uVar3,1,(Operation)local_70._M_len,field_name);
      pMVar1 = this_;
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pMVar1,2,sVar7,(uint8_t *)stream_local);
    }
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Mixin::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Mixin& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Mixin)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Mixin.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // string root = 2;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_root().empty()) {
      const ::std::string& _s = this_._internal_root();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Mixin.root");
      target = stream->WriteStringMaybeAliased(2, _s, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Mixin)
  return target;
}